

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O3

int main(void)

{
  uint uVar1;
  ostream *poVar2;
  Date tomorrow;
  Date today;
  char local_21;
  Date local_20;
  Date local_14;
  
  Date::Date(&local_14,0x7cc,dec,5);
  local_20.y = local_14.y;
  local_20.m = local_14.m;
  local_20.d = local_14.d;
  if (((local_20.m == feb) && (local_14.d == 0x1d)) &&
     ((uVar1 = local_20.y + 0x17, (uVar1 & 3) != 0 ||
      (((uVar1 * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar1 * 0x40000000) < 0x28f5c29 &&
       (uVar1 != ((int)uVar1 / 400) * 400)))))) {
    local_20.m = mar;
    local_20.d = 1;
  }
  local_20.y = local_20.y + 0x17;
  Date::add_month(&local_20,5);
  poVar2 = operator<<((ostream *)&std::cout,&local_14);
  local_21 = '\n';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_21,1);
  poVar2 = operator<<(poVar2,&local_20);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
	Date today{ 1996, Month::dec, 5 };
	Date tomorrow = today;

	try
	{
		tomorrow.add_year(23);
		tomorrow.add_month(5);
		std::cout << today
			<< '\n' << tomorrow << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}